

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celt_lpc.c
# Opt level: O2

void celt_iir(opus_val32 *_x,opus_val16 *den,opus_val32 *_y,int N,int ord,opus_val16 *mem)

{
  long lVar1;
  opus_val16 *y;
  float *pfVar2;
  opus_val32 *poVar3;
  undefined8 uVar4;
  undefined4 in_register_0000000c;
  ulong uVar5;
  int iVar6;
  undefined4 in_register_00000084;
  ulong uVar7;
  opus_val16 *x;
  long lVar8;
  long lVar9;
  long lVar10;
  opus_val32 oVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uStack_90;
  opus_val16 oStack_88;
  float fStack_84;
  undefined8 local_80;
  long local_78;
  opus_val32 *local_70;
  opus_val16 *local_68;
  float *local_60;
  opus_val32 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_58 = _y;
  local_60 = den;
  x = (opus_val16 *)((long)&oStack_88 - ((ulong)(uint)ord * 4 + 0xf & 0xfffffffffffffff0));
  local_50 = CONCAT44(in_register_0000000c,N);
  lVar8 = (long)x - ((ulong)(uint)(ord + N) * 4 + 0xf & 0xfffffffffffffff0);
  uVar5 = 0;
  uVar7 = 0;
  if (0 < ord) {
    uVar7 = (ulong)(uint)ord;
  }
  local_38 = CONCAT44(in_register_00000084,ord);
  iVar6 = ord + -1;
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    x[uVar5] = den[iVar6];
    iVar6 = iVar6 + -1;
  }
  iVar6 = (int)local_38;
  for (uVar5 = 0; iVar6 = iVar6 + -1, uVar7 != uVar5; uVar5 = uVar5 + 1) {
    *(float *)(lVar8 + uVar5 * 4) = -mem[iVar6];
  }
  for (uVar5 = uVar7; (long)uVar5 < (long)(ord + N); uVar5 = uVar5 + 1) {
    *(undefined4 *)(lVar8 + uVar5 * 4) = 0;
  }
  local_68 = mem;
  local_80 = (long)((int)local_50 + -3);
  lVar1 = lVar8 + (long)(int)local_38 * 4;
  local_78 = lVar8;
  local_70 = _x;
  lVar9 = lVar8;
  for (lVar10 = 0; uVar4 = local_38, lVar10 < local_80; lVar10 = lVar10 + 4) {
    local_48 = *(undefined8 *)(_x + lVar10);
    uStack_40 = *(undefined8 *)(_x + lVar10 + 2);
    y = (opus_val16 *)(local_78 + lVar10 * 4);
    *(undefined8 *)(lVar8 + -8) = 0x101861;
    xcorr_kernel(x,y,(opus_val32 *)&local_48,(int)uVar4);
    _x = local_70;
    fVar14 = (float)local_48;
    *(float *)(lVar1 + lVar10 * 4) = -(float)local_48;
    poVar3 = local_58;
    pfVar2 = local_60;
    local_58[lVar10] = (opus_val32)fVar14;
    fVar12 = local_48._4_4_ - *local_60 * fVar14;
    *(float *)(lVar1 + 4 + lVar10 * 4) = -fVar12;
    poVar3[lVar10 + 1] = (opus_val32)fVar12;
    fVar13 = ((float)uStack_40 - *pfVar2 * fVar12) - pfVar2[1] * fVar14;
    *(float *)(lVar1 + 8 + lVar10 * 4) = -fVar13;
    poVar3[lVar10 + 2] = (opus_val32)fVar13;
    fVar14 = ((uStack_40._4_4_ - fVar13 * *pfVar2) - fVar12 * pfVar2[1]) - fVar14 * pfVar2[2];
    *(float *)(lVar1 + 0xc + lVar10 * 4) = -fVar14;
    poVar3[lVar10 + 3] = (opus_val32)fVar14;
    lVar9 = lVar9 + 0x10;
  }
  iVar6 = (int)local_50;
  for (; lVar10 < iVar6; lVar10 = lVar10 + 1) {
    oVar11 = _x[lVar10];
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      oVar11 = (opus_val32)((float)oVar11 - x[uVar5] * *(float *)(lVar9 + uVar5 * 4));
    }
    *(opus_val32 *)(lVar1 + lVar10 * 4) = oVar11;
    local_58[lVar10] = oVar11;
    lVar9 = lVar9 + 4;
  }
  for (uVar5 = 0; iVar6 = iVar6 + -1, uVar7 != uVar5; uVar5 = uVar5 + 1) {
    local_68[uVar5] = (opus_val16)local_58[iVar6];
  }
  return;
}

Assistant:

void celt_iir(const opus_val32 *_x,
              const opus_val16 *den,
              opus_val32 *_y,
              int N,
              int ord,
              opus_val16 *mem) {
#ifdef SMALL_FOOTPRINT
    int i,j;
    for (i=0;i<N;i++)
    {
       opus_val32 sum = _x[i];
       for (j=0;j<ord;j++)
       {
          sum -= MULT16_16(den[j],mem[j]);
       }
       for (j=ord-1;j>=1;j--)
       {
          mem[j]=mem[j-1];
       }
       mem[0] = SROUND16(sum, SIG_SHIFT);
       _y[i] = sum;
    }
#else
    int i, j;
    celt_assert((ord & 3) == 0);
    opus_val16 rden[ord];
    opus_val16 y[N + ord];
    for (i = 0; i < ord; i++)
        rden[i] = den[ord - i - 1];
    for (i = 0; i < ord; i++)
        y[i] = -mem[ord - i - 1];
    for (; i < N + ord; i++)
        y[i] = 0;
    for (i = 0; i < N - 3; i += 4) {
        /* Unroll by 4 as if it were an FIR filter */
        opus_val32 sum[4];
        sum[0] = _x[i];
        sum[1] = _x[i + 1];
        sum[2] = _x[i + 2];
        sum[3] = _x[i + 3];
        xcorr_kernel(rden, y + i, sum, ord);

        /* Patch up the result to compensate for the fact that this is an IIR */
        y[i + ord] = -SROUND16(sum[0], SIG_SHIFT);
        _y[i] = sum[0];
        sum[1] = MAC16_16(sum[1], y[i + ord], den[0]);
        y[i + ord + 1] = -SROUND16(sum[1], SIG_SHIFT);
        _y[i + 1] = sum[1];
        sum[2] = MAC16_16(sum[2], y[i + ord + 1], den[0]);
        sum[2] = MAC16_16(sum[2], y[i + ord], den[1]);
        y[i + ord + 2] = -SROUND16(sum[2], SIG_SHIFT);
        _y[i + 2] = sum[2];

        sum[3] = MAC16_16(sum[3], y[i + ord + 2], den[0]);
        sum[3] = MAC16_16(sum[3], y[i + ord + 1], den[1]);
        sum[3] = MAC16_16(sum[3], y[i + ord], den[2]);
        y[i + ord + 3] = -SROUND16(sum[3], SIG_SHIFT);
        _y[i + 3] = sum[3];
    }
    for (; i < N; i++) {
        opus_val32 sum = _x[i];
        for (j = 0; j < ord; j++)
            sum -= MULT16_16(rden[j], y[i + j]);
        y[i + ord] = SROUND16(sum, SIG_SHIFT);
        _y[i] = sum;
    }
    for (i = 0; i < ord; i++)
        mem[i] = _y[N - i - 1];
#endif
}